

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlunicode.c
# Opt level: O0

int xmlUCSIsCatPc(int code)

{
  undefined1 local_d;
  int code_local;
  
  local_d = true;
  if (((code != 0x5f) &&
      (((code < 0x203f || (local_d = true, 0x2040 < code)) && (local_d = true, code != 0x2054)))) &&
     ((local_d = true, code != 0x30fb &&
      ((((code < 0xfe33 || (local_d = true, 0xfe34 < code)) &&
        ((code < 0xfe4d || (local_d = true, 0xfe4f < code)))) && (local_d = true, code != 0xff3f))))
     )) {
    local_d = code == 0xff65;
  }
  return (int)local_d;
}

Assistant:

int
xmlUCSIsCatPc(int code) {
    return((code == 0x5f) ||
           ((code >= 0x203f) && (code <= 0x2040)) ||
           (code == 0x2054) ||
           (code == 0x30fb) ||
           ((code >= 0xfe33) && (code <= 0xfe34)) ||
           ((code >= 0xfe4d) && (code <= 0xfe4f)) ||
           (code == 0xff3f) ||
           (code == 0xff65));
}